

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::LoadUSDZFromMemory
               (uint8_t *addr,size_t length,string *filename,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  size_type *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 *puVar9;
  long *plVar10;
  pointer pUVar11;
  char *pcVar12;
  char cVar13;
  string *err_00;
  ulong uVar14;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  assets;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  uint local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string *local_c8;
  string *local_c0;
  ulong local_b8;
  string *local_b0;
  size_t local_a8;
  uint local_9c;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  local_98;
  uint8_t *local_80;
  Stage *local_78;
  long *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = warn;
  bVar2 = anon_unknown_27::ParseUSDZHeader(addr,length,&local_98,err,warn);
  if (bVar2) {
    local_c8 = filename;
    local_b0 = err;
    local_a8 = length;
    local_80 = addr;
    local_78 = stage;
    if (local_98.
        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_98.
        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_ec = 0xffffffff;
      uVar15 = 0xffffffff;
    }
    else {
      uVar15 = 0xffffffff;
      local_b8 = 0;
      local_ec = 0xffffffff;
      uVar14 = 0;
      do {
        pUVar11 = local_98.
                  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar14;
        cVar13 = (char)pUVar11;
        lVar5 = ::std::__cxx11::string::rfind(cVar13,0x2e);
        if (lVar5 == -1) {
          local_68 = 0;
          local_60 = 0;
LAB_00127f94:
          local_110 = &local_100;
          local_100 = CONCAT71(uStack_5f,local_60);
          lStack_f8 = lStack_58;
        }
        else {
          ::std::__cxx11::string::rfind(cVar13,0x2e);
          ::std::__cxx11::string::substr((ulong)&local_70,(ulong)pUVar11);
          lVar5 = local_68;
          plVar7 = local_70;
          if (local_68 != 0) {
            lVar17 = 0;
            local_9c = uVar15;
            do {
              iVar4 = tolower((uint)*(byte *)((long)plVar7 + lVar17));
              *(char *)((long)plVar7 + lVar17) = (char)iVar4;
              lVar17 = lVar17 + 1;
              uVar15 = local_9c;
            } while (lVar5 != lVar17);
          }
          if (local_70 == (long *)&local_60) goto LAB_00127f94;
          local_100 = CONCAT71(uStack_5f,local_60);
          local_110 = local_70;
        }
        local_108 = local_68;
        local_68 = 0;
        local_60 = 0;
        local_70 = (long *)&local_60;
        iVar4 = ::std::__cxx11::string::compare((char *)&local_110);
        if (iVar4 == 0) {
          uVar6 = local_b8;
          if (-1 < (int)uVar15) {
            uVar6 = local_b8 & 0xff;
            if ((local_b8 & 1) == 0) {
              uVar6 = 1;
            }
            if ((local_c0 != (string *)0x0) && ((local_b8 & 1) == 0)) {
              ::std::operator+(&local_50,
                               "Multiple USDC files were found in USDZ. Use the first found one: ",
                               &local_98.
                                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar15].filename);
              plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_e8.field_2._M_allocated_capacity = *psVar1;
                local_e8.field_2._8_8_ = plVar7[3];
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              }
              else {
                local_e8.field_2._M_allocated_capacity = *psVar1;
                local_e8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_e8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              paVar8 = &local_50.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != paVar8) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
                paVar8 = extraout_RAX;
              }
              uVar6 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
            }
          }
          local_b8 = uVar6;
          if (uVar15 == 0xffffffff) {
            uVar15 = (uint)uVar14;
          }
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)&local_110);
          if (iVar4 == 0) {
            uVar6 = local_b8;
            if (-1 < (int)local_ec) {
              uVar6 = local_b8 & 0xff;
              if ((local_b8 & 1) == 0) {
                uVar6 = 1;
              }
              if ((local_c0 != (string *)0x0) && ((local_b8 & 1) == 0)) {
                ::std::operator+(&local_50,
                                 "Multiple USDA files were found in USDZ. Use the first found one: "
                                 ,&local_98.
                                   super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_ec].filename);
                plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_e8.field_2._M_allocated_capacity = *psVar1;
                  local_e8.field_2._8_8_ = plVar7[3];
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                }
                else {
                  local_e8.field_2._M_allocated_capacity = *psVar1;
                  local_e8._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_e8._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_e8._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                paVar8 = &local_50.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != paVar8) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                  paVar8 = extraout_RAX_00;
                }
                uVar6 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
              }
            }
            local_b8 = uVar6;
            if (local_ec == 0xffffffff) {
              local_ec = (uint)uVar14;
            }
          }
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)(((long)local_98.
                                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_98.
                                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555));
    }
    err_00 = local_b0;
    if ((uVar15 & local_ec) == 0xffffffff) {
      if (local_b0 != (string *)0x0) {
        ::std::__cxx11::string::append((char *)local_b0);
      }
    }
    else if (((local_c0 == (string *)0x0) || ((int)uVar15 < 0)) || ((int)local_ec < 0)) {
      sVar16 = local_a8;
      if (-1 < (int)uVar15) goto LAB_001283ae;
      bVar2 = true;
      if ((int)local_ec < 0) goto LAB_00128547;
      uVar14 = local_98.
               super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[local_ec].byte_begin;
      uVar6 = local_98.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[local_ec].byte_end;
      if (uVar14 <= uVar6) {
        if (local_a8 < uVar14) {
          if (local_b0 != (string *)0x0) {
            pcVar12 = "Invalid start offset to USDA data: [";
            goto LAB_00128599;
          }
        }
        else if (local_a8 < uVar6) {
          if (local_b0 != (string *)0x0) {
            pcVar12 = "Invalid end offset to USDA data: [";
            goto LAB_00128599;
          }
        }
        else {
          bVar3 = LoadUSDAFromMemory(local_80 + uVar14,uVar6 - uVar14,local_c8,local_78,local_c0,
                                     local_b0,options);
          if (bVar3) goto LAB_00128547;
          if (err_00 != (string *)0x0) {
            pcVar12 = "Failed to load USDA: [";
            goto LAB_00128599;
          }
        }
        goto LAB_00128545;
      }
      if (local_b0 == (string *)0x0) goto LAB_00128545;
      pcVar12 = "Invalid start/end offset to USDA data: [";
LAB_00128599:
      ::std::operator+(&local_e8,pcVar12,local_c8);
      puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_e8);
      local_110 = &local_100;
      plVar7 = puVar9 + 2;
      if ((long *)*puVar9 == plVar7) {
        local_100 = *plVar7;
        lStack_f8 = puVar9[3];
      }
      else {
        local_100 = *plVar7;
        local_110 = (long *)*puVar9;
      }
      local_108 = puVar9[1];
      *puVar9 = plVar7;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
LAB_0012850e:
      ::std::__cxx11::string::_M_append((char *)err_00,(ulong)local_110);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      ::std::operator+(&local_e8,"Both USDA and USDC file found. Use USDC file [",
                       &local_98.
                        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15].filename);
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_e8);
      sVar16 = local_a8;
      err_00 = local_b0;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_100 = *plVar10;
        lStack_f8 = plVar7[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar10;
        local_110 = (long *)*plVar7;
      }
      local_108 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_110);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
LAB_001283ae:
      uVar14 = local_98.
               super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].byte_begin;
      uVar6 = local_98.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].byte_end;
      if (uVar6 < uVar14) {
        if (err_00 != (string *)0x0) {
          pcVar12 = "Invalid start/end offset to USDC data: [";
LAB_001284a2:
          ::std::operator+(&local_e8,pcVar12,local_c8);
          plVar7 = (long *)::std::__cxx11::string::append((char *)&local_e8);
          local_110 = &local_100;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_100 = *plVar10;
            lStack_f8 = plVar7[3];
          }
          else {
            local_100 = *plVar10;
            local_110 = (long *)*plVar7;
          }
          local_108 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          goto LAB_0012850e;
        }
      }
      else if (sVar16 < uVar14) {
        if (err_00 != (string *)0x0) {
          pcVar12 = "Invalid start offset to USDC data: [";
          goto LAB_001284a2;
        }
      }
      else if (sVar16 < uVar6) {
        if (err_00 != (string *)0x0) {
          pcVar12 = "Invalid end offset to USDC data: [";
          goto LAB_001284a2;
        }
      }
      else {
        bVar3 = LoadUSDCFromMemory(local_80 + uVar14,uVar6 - uVar14,local_c8,local_78,local_c0,
                                   err_00,options);
        bVar2 = true;
        if (bVar3) goto LAB_00128547;
        if (err_00 != (string *)0x0) {
          pcVar12 = "Failed to load USDC: [";
          goto LAB_001284a2;
        }
      }
    }
  }
LAB_00128545:
  bVar2 = false;
LAB_00128547:
  std::
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ::~vector(&local_98);
  return bVar2;
}

Assistant:

bool LoadUSDZFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &filename, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  std::vector<USDZAssetInfo> assets;
  if (!ParseUSDZHeader(addr, length, &assets, warn, err)) {
    return false;
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i < assets.size(); i++) {
    DCOUT("[" << i << "] " << assets[i].filename << " : byte range ("
              << assets[i].byte_begin << ", " << assets[i].byte_end << ")");
  }
#endif

  int32_t usdc_index = -1;
  int32_t usda_index = -1;
  {
    bool warned = false;  // to report single warning message.
    for (size_t i = 0; i < assets.size(); i++) {
      std::string ext = str_tolower(GetFileExtension(assets[i].filename));
      if (ext.compare("usdc") == 0) {
        if ((usdc_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDC files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usdc_index)].filename + "]\n";
          }
          warned = true;
        }

        if (usdc_index == -1) {
          usdc_index = int32_t(i);
        }
      } else if (ext.compare("usda") == 0) {
        if ((usda_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDA files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usda_index)].filename + "]\n";
          }
          warned = true;
        }
        if (usda_index == -1) {
          usda_index = int32_t(i);
        }
      }
    }
  }

  if ((usdc_index == -1) && (usda_index == -1)) {
    if (err) {
      (*err) += "Neither USDC nor USDA file found in USDZ\n";
    }
    return false;
  }

  if ((usdc_index >= 0) && (usda_index >= 0)) {
    if (warn) {
      (*warn) += "Both USDA and USDC file found. Use USDC file [" +
                 assets[size_t(usdc_index)].filename + "]\n";
    }
  }

  if (usdc_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usdc_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usdc_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usdc_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usdc_addr = addr + start_addr_offset;
    bool ret = LoadUSDCFromMemory(usdc_addr, usdc_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDC: [" + filename + "].\n";
      }

      return false;
    }
  } else if (usda_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usda_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usda_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usda_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usda_addr = addr + start_addr_offset;
    bool ret = LoadUSDAFromMemory(usda_addr, usda_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDA: [" + filename + "].\n";
      }

      return false;
    }
  }

#if 0 // TODO: Remove
  // Decode images
  for (size_t i = 0; i < assets.size(); i++) {
    const std::string &uri = assets[i].filename;
    const std::string ext = GetFileExtension(uri);

    if ((ext.compare("png") == 0) || (ext.compare("jpg") == 0) ||
        (ext.compare("jpeg") == 0)) {
      const size_t start_addr_offset = assets[i].byte_begin;
      const size_t end_addr_offset = assets[i].byte_end;
      const size_t asset_size = end_addr_offset - start_addr_offset;
      const uint8_t *asset_addr = addr + start_addr_offset;

      if (end_addr_offset < start_addr_offset) {
        if (err) {
          (*err) += "Invalid start/end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (start_addr_offset > length) {
        if (err) {
          (*err) += "Invalid start offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (end_addr_offset > length) {
        if (err) {
          (*err) += "Invalid end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (asset_size > (options.max_allowed_asset_size_in_mb * 1024ull * 1024ull)) {
        PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] file size too large. {} bytes (max_allowed_asset_size {})",
          i, asset_size, options.max_allowed_asset_size_in_mb * 1024ull * 1024ull));
      }

      DCOUT("Image asset size: " << asset_size);

      {
        nonstd::expected<image::ImageInfoResult, std::string> info =
            image::GetImageInfoFromMemory(asset_addr, asset_size, uri);

        if (info) {
          if (info->width == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Assset no[{}] Image has zero width.", i));
          }

          if (info->width > options.max_image_width) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ, fmt::format("Asset no[{}] Image width too large. {} (max_image_width {})", i, info->width, options.max_image_width));
          }

          if (info->height == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero height.", i));
          }

          if (info->height > options.max_image_height) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image height too large. {} (max_image_height {})", i, info->height, options.max_image_height));
          }

          if (info->channels == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero channels.", i));
          }

          if (info->channels > options.max_image_channels) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image channels too much", i));
          }
        }
      }

      Image image;
      nonstd::expected<image::ImageResult, std::string> ret =
          image::LoadImageFromMemory(asset_addr, asset_size, uri);

      if (!ret) {
        (*err) += ret.error();
      } else {
        image = (*ret).image;
        if (!(*ret).warning.empty()) {
          (*warn) += (*ret).warning;
        }
      }
    } else {
      // TODO: Support other asserts(e.g. audio mp3)
    }
  }
#endif

  return true;
}